

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

AsmJsRetType Wasm::WasmToAsmJs::GetAsmJsReturnType(WasmType wasmType)

{
  WasmCompilationException *this;
  AsmJsRetType local_c;
  WasmType wasmType_local;
  
  switch(wasmType) {
  case Void:
    Js::AsmJsRetType::AsmJsRetType(&local_c,Void);
    break;
  case FirstLocalType:
    Js::AsmJsRetType::AsmJsRetType(&local_c,Signed);
    break;
  case I64:
    Js::AsmJsRetType::AsmJsRetType(&local_c,Int64);
    break;
  case F32:
    Js::AsmJsRetType::AsmJsRetType(&local_c,Float);
    break;
  case F64:
    Js::AsmJsRetType::AsmJsRetType(&local_c,Double);
    break;
  case V128:
    Simd::EnsureSimdIsEnabled();
    Js::AsmJsRetType::AsmJsRetType(&local_c,Float32x4);
    break;
  default:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    this = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this,L"Unknown return type %u",(ulong)wasmType);
    __cxa_throw(this,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  return (AsmJsRetType)local_c.which_;
}

Assistant:

Js::AsmJsRetType WasmToAsmJs::GetAsmJsReturnType(WasmTypes::WasmType wasmType)
{
    switch (wasmType)
    {
    case WasmTypes::I32: return Js::AsmJsRetType::Signed;
    case WasmTypes::I64: return Js::AsmJsRetType::Int64;
    case WasmTypes::F32: return Js::AsmJsRetType::Float;
    case WasmTypes::F64: return Js::AsmJsRetType::Double;
    case WasmTypes::Void: return Js::AsmJsRetType::Void;
#ifdef ENABLE_WASM_SIMD
    case WasmTypes::V128:
        Simd::EnsureSimdIsEnabled();
        return Js::AsmJsRetType::Float32x4;
#endif
    default:
        WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
        throw WasmCompilationException(_u("Unknown return type %u"), wasmType);
    }
}